

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O2

string * ApprovalTests::StringUtils::rightTrim(string *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  pointer pcVar2;
  bool bVar3;
  pointer pcVar4;
  pointer pcVar5;
  string *__it;
  long lVar6;
  size_type sVar7;
  pointer local_68;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  pcVar2 = (s->_M_dataplus)._M_p;
  sVar7 = s->_M_string_length;
  pcVar1 = pcVar2 + sVar7;
  __it = s;
  for (lVar6 = (long)sVar7 >> 2; pcVar5 = pcVar2 + sVar7, pcVar4 = pcVar5, 0 < lVar6;
      lVar6 = lVar6 + -1) {
    local_50 = pcVar5;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ApprovalTests::StringUtils::rightTrim(std::__cxx11::string)::$_0>::operator()
                      ((_Iter_pred<ApprovalTests::StringUtils::rightTrim(std::__cxx11::string)::__0>
                        *)&local_50,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    if (bVar3) goto LAB_0012b347;
    local_58 = pcVar2 + (sVar7 - 1);
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ApprovalTests::StringUtils::rightTrim(std::__cxx11::string)::$_0>::operator()
                      ((_Iter_pred<ApprovalTests::StringUtils::rightTrim(std::__cxx11::string)::__0>
                        *)&local_58,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    pcVar4 = pcVar2 + (sVar7 - 1);
    if (bVar3) goto LAB_0012b347;
    local_60 = pcVar2 + (sVar7 - 2);
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ApprovalTests::StringUtils::rightTrim(std::__cxx11::string)::$_0>::operator()
                      ((_Iter_pred<ApprovalTests::StringUtils::rightTrim(std::__cxx11::string)::__0>
                        *)&local_60,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    pcVar4 = pcVar2 + (sVar7 - 2);
    if (bVar3) goto LAB_0012b347;
    local_68 = pcVar2 + (sVar7 - 3);
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ApprovalTests::StringUtils::rightTrim(std::__cxx11::string)::$_0>::operator()
                      ((_Iter_pred<ApprovalTests::StringUtils::rightTrim(std::__cxx11::string)::__0>
                        *)&local_68,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    pcVar4 = pcVar2 + (sVar7 - 3);
    if (bVar3) goto LAB_0012b347;
    sVar7 = sVar7 - 4;
  }
  if (sVar7 == 3) {
    local_38 = pcVar5;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ApprovalTests::StringUtils::rightTrim(std::__cxx11::string)::$_0>::operator()
                      ((_Iter_pred<ApprovalTests::StringUtils::rightTrim(std::__cxx11::string)::__0>
                        *)&local_38,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    if (bVar3) goto LAB_0012b347;
    pcVar5 = pcVar2 + 2;
LAB_0012b38f:
    local_40 = pcVar5;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ApprovalTests::StringUtils::rightTrim(std::__cxx11::string)::$_0>::operator()
                      ((_Iter_pred<ApprovalTests::StringUtils::rightTrim(std::__cxx11::string)::__0>
                        *)&local_40,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    pcVar4 = pcVar5;
    if (bVar3) goto LAB_0012b347;
    pcVar5 = pcVar5 + -1;
  }
  else {
    if (sVar7 == 2) goto LAB_0012b38f;
    pcVar4 = pcVar2;
    if (sVar7 != 1) goto LAB_0012b347;
  }
  local_48 = pcVar5;
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<ApprovalTests::StringUtils::rightTrim(std::__cxx11::string)::$_0>::operator()
                    ((_Iter_pred<ApprovalTests::StringUtils::rightTrim(std::__cxx11::string)::__0> *
                     )&local_48,
                     (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)__it);
  pcVar4 = pcVar2;
  if (bVar3) {
    pcVar4 = pcVar5;
  }
LAB_0012b347:
  ::std::__cxx11::string::erase(s,pcVar4,pcVar1);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  return __return_storage_ptr__;
}

Assistant:

APPROVAL_TESTS_NO_DISCARD
    std::string StringUtils::rightTrim(std::string s)
    {
        s.erase(std::find_if(s.rbegin(),
                             s.rend(),
                             [](unsigned char ch) { return !std::isspace(ch); })
                    .base(),
                s.end());
        return s;
    }